

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_inc.h
# Opt level: O0

void CreateBackwardReferencesNH5
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               BrotliEncoderParams *params,HasherHandle hasher,int *dist_cache,
               size_t *last_insert_len,Command *commands,size_t *num_commands,size_t *num_literals)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  bool bVar6;
  Command *pCVar7;
  uint32_t uVar8;
  int iVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  long lVar12;
  ulong uVar13;
  uint8_t *puVar14;
  ulong uVar15;
  uint8_t *puVar16;
  ulong uVar17;
  uint8_t *puVar18;
  long lVar19;
  byte bVar20;
  int *piVar21;
  BrotliEncoderDictionary *pBVar22;
  uint8_t *local_ce0;
  uint8_t *local_cd0;
  uint8_t *local_cc0;
  uint8_t *local_cb8;
  uint8_t *local_ca8;
  uint8_t *local_c90;
  ulong local_c88;
  uint8_t *local_c80;
  ulong local_c78;
  ulong local_c70;
  ulong local_c68;
  uint8_t *local_c60;
  uint8_t *local_c58;
  size_t pos_jump_1;
  size_t kMargin_1;
  size_t pos_jump;
  size_t kMargin;
  size_t range_end;
  size_t range_start;
  size_t distance_code;
  HasherSearchResult sr2;
  size_t cost_diff_lazy;
  size_t sStack_be8;
  int delayed_backward_references_in_row;
  HasherSearchResult sr;
  size_t max_distance;
  size_t max_length;
  size_t kMinScore;
  size_t gap;
  size_t apply_random_heuristics;
  size_t random_heuristics_window_size;
  size_t store_end;
  size_t pos_end;
  size_t insert_length;
  Command *orig_commands;
  size_t max_backward_limit;
  HasherHandle hasher_local;
  BrotliEncoderParams *params_local;
  size_t ringbuffer_mask_local;
  uint8_t *ringbuffer_local;
  size_t position_local;
  size_t num_bytes_local;
  size_t offset1;
  size_t offset0;
  size_t distance_plus_3;
  ulong local_a88;
  uint32_t delta;
  size_t nbits;
  size_t offset_2;
  size_t prefix;
  size_t postfix;
  size_t postfix_mask;
  size_t bucket_2;
  size_t dist_2;
  uint16_t copycode;
  uint16_t inscode;
  uint32_t nbits_1;
  ushort local_972;
  uint32_t nbits_2;
  ushort local_94a;
  int offset_3;
  uint16_t bits64;
  ushort local_922;
  size_t score_4;
  size_t len_4;
  size_t backward_4;
  size_t prev_ix_3;
  size_t down_1;
  uint32_t *bucket_1;
  ulong uStack_8b8;
  uint32_t key_2;
  size_t score_3;
  size_t len_3;
  size_t prev_ix_2;
  size_t backward_3;
  size_t i_2;
  size_t best_len_1;
  size_t best_score_1;
  size_t min_score_1;
  size_t cur_ix_masked_1;
  uint32_t *buckets_1;
  uint16_t *num_1;
  H5 *self_2;
  HasherCommon *common_1;
  size_t matching_bits_4;
  uint64_t x_4;
  size_t limit2_4;
  size_t matched_4;
  ulong *local_7d0;
  size_t local_7c0;
  size_t matching_bits_3;
  uint64_t x_3;
  size_t limit2_3;
  size_t matched_3;
  ulong *local_790;
  size_t local_780;
  int item_matches_1;
  size_t item_1;
  HasherCommon *self_3;
  size_t i_3;
  size_t key_3;
  uint32_t h_1;
  size_t transform_id_1;
  size_t cut_1;
  size_t score_5;
  size_t backward_5;
  size_t matchlen_1;
  size_t offset_1;
  size_t dist_1;
  size_t len_5;
  size_t matching_bits_5;
  uint64_t x_5;
  size_t limit2_5;
  size_t matched_5;
  ulong *local_5e8;
  size_t local_5d8;
  size_t score_1;
  size_t len_1;
  size_t backward_1;
  size_t prev_ix_1;
  size_t down;
  uint32_t *bucket;
  ulong uStack_558;
  uint32_t key;
  size_t score;
  size_t len;
  size_t prev_ix;
  size_t backward;
  size_t i;
  size_t best_len;
  size_t best_score;
  size_t min_score;
  size_t cur_ix_masked;
  uint32_t *buckets;
  uint16_t *num;
  H5 *self;
  HasherCommon *common;
  size_t matching_bits_1;
  uint64_t x_1;
  size_t limit2_1;
  size_t matched_1;
  ulong *local_470;
  size_t local_460;
  size_t matching_bits;
  uint64_t x;
  size_t limit2;
  size_t matched;
  ulong *local_430;
  size_t local_420;
  int item_matches;
  size_t item;
  HasherCommon *self_1;
  size_t i_1;
  size_t key_1;
  uint32_t h;
  size_t transform_id;
  size_t cut;
  size_t score_2;
  size_t backward_2;
  size_t matchlen;
  size_t offset;
  size_t dist;
  size_t len_2;
  size_t matching_bits_2;
  uint64_t x_2;
  size_t limit2_2;
  size_t matched_2;
  ulong *local_288;
  size_t local_278;
  uint8_t *local_230;
  size_t i_4;
  size_t offset_4;
  size_t minor_ix;
  uint32_t key_4;
  uint16_t *num_2;
  H5 *self_4;
  size_t offset_6;
  size_t minor_ix_2;
  uint32_t key_6;
  uint16_t *num_4;
  H5 *self_6;
  size_t offset_5;
  size_t minor_ix_1;
  uint32_t key_5;
  uint16_t *num_3;
  H5 *self_5;
  int next_last_distance;
  int last_distance;
  int next_last_distance_1;
  int last_distance_1;
  
  pCVar7 = commands;
  puVar10 = (uint8_t *)((1L << ((byte)params->lgwin & 0x3f)) - 0x10);
  pos_end = *last_insert_len;
  puVar11 = (uint8_t *)(position + num_bytes);
  local_c58 = (uint8_t *)position;
  if (3 < num_bytes) {
    local_c58 = (uint8_t *)((position + num_bytes) - 3);
  }
  iVar9 = 0x200;
  if (params->quality < 9) {
    iVar9 = 0x40;
  }
  lVar12 = (long)iVar9;
  gap = position + lVar12;
  iVar9 = *(int *)(hasher + 0x10);
  puVar18 = (uint8_t *)position;
  if (4 < iVar9) {
    iVar2 = *dist_cache;
    dist_cache[4] = iVar2 + -1;
    dist_cache[5] = iVar2 + 1;
    dist_cache[6] = iVar2 + -2;
    dist_cache[7] = iVar2 + 2;
    dist_cache[8] = iVar2 + -3;
    dist_cache[9] = iVar2 + 3;
    puVar18 = (uint8_t *)position;
    if (10 < iVar9) {
      iVar9 = dist_cache[1];
      dist_cache[10] = iVar9 + -1;
      dist_cache[0xb] = iVar9 + 1;
      dist_cache[0xc] = iVar9 + -2;
      dist_cache[0xd] = iVar9 + 2;
      dist_cache[0xe] = iVar9 + -3;
      dist_cache[0xf] = iVar9 + 3;
      puVar18 = (uint8_t *)position;
    }
  }
LAB_00109d8d:
  do {
    ringbuffer_local = puVar18;
    if (puVar11 <= ringbuffer_local + 4) {
      *last_insert_len = (size_t)(puVar11 + (pos_end - (long)ringbuffer_local));
      *num_commands = ((long)commands - (long)pCVar7 >> 4) + *num_commands;
      return;
    }
    max_distance = (long)puVar11 - (long)ringbuffer_local;
    local_c60 = puVar10;
    if (ringbuffer_local < puVar10) {
      local_c60 = ringbuffer_local;
    }
    sr.score = 0;
    sr.len = 0;
    sr.distance = 0x7e4;
    pBVar22 = &params->dictionary;
    puVar18 = (uint8_t *)(params->dist).max_distance;
    lVar19 = *(long *)(hasher + 0x28);
    uVar13 = (ulong)ringbuffer_local & ringbuffer_mask;
    best_len = 0x7e4;
    i = 0;
    sStack_be8 = 0;
    sr.score._0_4_ = 0;
    for (backward = 0; backward < (ulong)(long)*(int *)(hasher + 0x10); backward = backward + 1) {
      puVar14 = (uint8_t *)(long)dist_cache[backward];
      if ((((ringbuffer_local + -(long)puVar14 < ringbuffer_local) && (puVar14 <= local_c60)) &&
          (uVar15 = ringbuffer_mask & (ulong)(ringbuffer_local + -(long)puVar14),
          uVar13 + i <= ringbuffer_mask)) &&
         ((uVar15 + i <= ringbuffer_mask && (ringbuffer[uVar13 + i] == ringbuffer[uVar15 + i])))) {
        local_430 = (ulong *)(ringbuffer + uVar13);
        limit2 = 0;
        x = (max_distance >> 3) + 1;
LAB_0010a12e:
        x = x - 1;
        if (x != 0) {
          if (*local_430 == *(ulong *)(ringbuffer + limit2 + uVar15)) goto LAB_0010a190;
          iVar9 = 0;
          for (uVar15 = *local_430 ^ *(ulong *)(ringbuffer + limit2 + uVar15); (uVar15 & 1) == 0;
              uVar15 = uVar15 >> 1 | 0x8000000000000000) {
            iVar9 = iVar9 + 1;
          }
          local_420 = ((ulong)(long)iVar9 >> 3) + limit2;
          goto LAB_0010a2d1;
        }
        matched = (max_distance & 7) + 1;
        while (matched = matched - 1, matched != 0) {
          if (ringbuffer[limit2 + uVar15] != (uint8_t)*local_430) {
            local_420 = limit2;
            goto LAB_0010a2d1;
          }
          local_430 = (ulong *)((long)local_430 + 1);
          limit2 = limit2 + 1;
        }
        local_420 = limit2;
LAB_0010a2d1:
        if (((2 < local_420) || ((local_420 == 2 && (backward < 2)))) &&
           (uStack_558 = local_420 * 0x87 + 0x78f, best_len < uStack_558)) {
          if (backward != 0) {
            uStack_558 = uStack_558 - ((long)(int)(0x1ca10 >> ((byte)backward & 0xe) & 0xe) + 0x27);
          }
          if (best_len < uStack_558) {
            best_len = uStack_558;
            i = local_420;
            sStack_be8 = local_420;
            sr.distance = uStack_558;
            sr.len = (size_t)puVar14;
          }
        }
      }
    }
    uVar8 = HashBytesH5(ringbuffer + uVar13,*(int *)(hasher + 0x38));
    lVar19 = (ulong)(uVar8 << ((byte)*(undefined4 *)(hasher + 8) & 0x1f)) * 4 + lVar19 * 2 + 0x40;
    if (*(ulong *)(hasher + 0x30) < (ulong)*(ushort *)(hasher + (ulong)uVar8 * 2 + 0x40)) {
      local_c68 = (ulong)*(ushort *)(hasher + (ulong)uVar8 * 2 + 0x40) - *(long *)(hasher + 0x30);
    }
    else {
      local_c68 = 0;
    }
    backward = (size_t)*(ushort *)(hasher + (ulong)uVar8 * 2 + 0x40);
    while (local_c68 < backward) {
      backward = backward - 1;
      puVar14 = ringbuffer_local +
                -(ulong)*(uint *)(hasher + (backward & *(uint *)(hasher + 0x3c)) * 4 + lVar19);
      if (local_c60 < puVar14) break;
      uVar15 = ringbuffer_mask &
               *(uint *)(hasher + (backward & *(uint *)(hasher + 0x3c)) * 4 + lVar19);
      if (((uVar13 + i <= ringbuffer_mask) && (uVar15 + i <= ringbuffer_mask)) &&
         (ringbuffer[uVar13 + i] == ringbuffer[uVar15 + i])) {
        local_470 = (ulong *)(ringbuffer + uVar13);
        limit2_1 = 0;
        x_1 = (max_distance >> 3) + 1;
LAB_0010a610:
        x_1 = x_1 - 1;
        if (x_1 != 0) {
          if (*local_470 == *(ulong *)(ringbuffer + limit2_1 + uVar15)) goto LAB_0010a672;
          iVar9 = 0;
          for (uVar15 = *local_470 ^ *(ulong *)(ringbuffer + limit2_1 + uVar15); (uVar15 & 1) == 0;
              uVar15 = uVar15 >> 1 | 0x8000000000000000) {
            iVar9 = iVar9 + 1;
          }
          local_460 = ((ulong)(long)iVar9 >> 3) + limit2_1;
          goto LAB_0010a7b3;
        }
        matched_1 = (max_distance & 7) + 1;
        while (matched_1 = matched_1 - 1, matched_1 != 0) {
          if (ringbuffer[limit2_1 + uVar15] != (uint8_t)*local_470) {
            local_460 = limit2_1;
            goto LAB_0010a7b3;
          }
          local_470 = (ulong *)((long)local_470 + 1);
          limit2_1 = limit2_1 + 1;
        }
        local_460 = limit2_1;
LAB_0010a7b3:
        if (3 < local_460) {
          iVar9 = 0x1f;
          if ((uint)puVar14 != 0) {
            for (; (uint)puVar14 >> iVar9 == 0; iVar9 = iVar9 + -1) {
            }
          }
          uVar15 = (local_460 * 0x87 + 0x780) - (ulong)(uint)(iVar9 * 0x1e);
          if (best_len < uVar15) {
            i = local_460;
            sStack_be8 = local_460;
            sr.len = (size_t)puVar14;
            sr.distance = uVar15;
            best_len = uVar15;
          }
        }
      }
    }
    *(int *)(hasher + (ulong)((uint)*(ushort *)(hasher + (ulong)uVar8 * 2 + 0x40) &
                             *(uint *)(hasher + 0x3c)) * 4 + lVar19) = (int)ringbuffer_local;
    *(short *)(hasher + (ulong)uVar8 * 2 + 0x40) = *(short *)(hasher + (ulong)uVar8 * 2 + 0x40) + 1;
    if ((sr.distance == 0x7e4) &&
       (piVar21 = (int *)(ringbuffer + uVar13),
       *(ulong *)(hasher + 0x18) >> 7 <= *(ulong *)(hasher + 0x20))) {
      i_1 = (size_t)(((uint)(*piVar21 * 0x1e35a7bd) >> 0x12) << 1);
      for (self_1 = (HasherCommon *)0x0; self_1 < (HasherCommon *)0x2;
          self_1 = (HasherCommon *)((long)&(self_1->params).type + 1)) {
        uVar1 = (params->dictionary).hash_table[i_1];
        uVar13 = (ulong)uVar1;
        *(long *)(hasher + 0x18) = *(long *)(hasher + 0x18) + 1;
        if (uVar13 != 0) {
          uVar15 = uVar13 & 0x1f;
          uVar17 = (ulong)(uVar1 >> 5);
          if (max_distance < uVar15) {
            bVar6 = false;
          }
          else {
            local_288 = (ulong *)(pBVar22->words->data +
                                 (ulong)pBVar22->words->offsets_by_length[uVar15] + uVar15 * uVar17)
            ;
            limit2_2 = 0;
            x_2 = (uVar15 >> 3) + 1;
LAB_0010ab8f:
            x_2 = x_2 - 1;
            if (x_2 != 0) {
              if (*local_288 == *(ulong *)((long)piVar21 + limit2_2)) goto LAB_0010abf1;
              iVar9 = 0;
              for (uVar13 = *local_288 ^ *(ulong *)((long)piVar21 + limit2_2); (uVar13 & 1) == 0;
                  uVar13 = uVar13 >> 1 | 0x8000000000000000) {
                iVar9 = iVar9 + 1;
              }
              local_278 = ((ulong)(long)iVar9 >> 3) + limit2_2;
              goto LAB_0010ad32;
            }
            matched_2 = (uVar13 & 7) + 1;
            while (matched_2 = matched_2 - 1, matched_2 != 0) {
              if (*(char *)((long)piVar21 + limit2_2) != (char)*local_288) {
                local_278 = limit2_2;
                goto LAB_0010ad32;
              }
              local_288 = (ulong *)((long)local_288 + 1);
              limit2_2 = limit2_2 + 1;
            }
            local_278 = limit2_2;
LAB_0010ad32:
            if ((uVar15 < local_278 + (params->dictionary).cutoffTransformsCount) &&
               (local_278 != 0)) {
              puVar14 = local_c60 +
                        ((uVar15 - local_278) * 4 +
                         ((params->dictionary).cutoffTransforms >>
                          ((char)(uVar15 - local_278) * '\x06' & 0x3fU) & 0x3f) <<
                        (pBVar22->words->size_bits_by_length[uVar15] & 0x3f)) + uVar17 + 1;
              if (puVar18 < puVar14) {
                bVar6 = false;
              }
              else {
                iVar9 = 0x1f;
                if ((uint)puVar14 != 0) {
                  for (; (uint)puVar14 >> iVar9 == 0; iVar9 = iVar9 + -1) {
                  }
                }
                uVar13 = (local_278 * 0x87 + 0x780) - (ulong)(uint)(iVar9 * 0x1e);
                if (uVar13 < sr.distance) {
                  bVar6 = false;
                }
                else {
                  sStack_be8 = local_278;
                  sr.score._0_4_ = (int)uVar15 - (int)local_278;
                  bVar6 = true;
                  sr.len = (size_t)puVar14;
                  sr.distance = uVar13;
                }
              }
            }
            else {
              bVar6 = false;
            }
          }
          if (bVar6) {
            *(long *)(hasher + 0x20) = *(long *)(hasher + 0x20) + 1;
          }
        }
        i_1 = i_1 + 1;
      }
    }
    if (0x7e4 < sr.distance) {
      cost_diff_lazy._4_4_ = 0;
      do {
        max_distance = max_distance - 1;
        if (params->quality < 5) {
          local_c70 = sStack_be8 - 1;
          if (max_distance <= local_c70) {
            local_c70 = max_distance;
          }
          local_c78 = local_c70;
        }
        else {
          local_c78 = 0;
        }
        sr2.len = 0;
        sr2.distance = 0x7e4;
        local_c80 = puVar10;
        if (ringbuffer_local + 1 < puVar10) {
          local_c80 = ringbuffer_local + 1;
        }
        pBVar22 = &params->dictionary;
        puVar14 = ringbuffer_local + 1;
        puVar18 = (uint8_t *)(params->dist).max_distance;
        lVar19 = *(long *)(hasher + 0x28);
        uVar13 = (ulong)puVar14 & ringbuffer_mask;
        best_len_1 = 0x7e4;
        i_2 = local_c78;
        distance_code = 0;
        sr2.score._0_4_ = 0;
        for (backward_3 = 0; backward_3 < (ulong)(long)*(int *)(hasher + 0x10);
            backward_3 = backward_3 + 1) {
          puVar16 = (uint8_t *)(long)dist_cache[backward_3];
          if ((((puVar14 + -(long)puVar16 < puVar14) && (puVar16 <= local_c80)) &&
              (uVar15 = ringbuffer_mask & (ulong)(puVar14 + -(long)puVar16),
              uVar13 + i_2 <= ringbuffer_mask)) &&
             ((uVar15 + i_2 <= ringbuffer_mask &&
              (ringbuffer[uVar13 + i_2] == ringbuffer[uVar15 + i_2])))) {
            local_790 = (ulong *)(ringbuffer + uVar13);
            limit2_3 = 0;
            x_3 = (max_distance >> 3) + 1;
LAB_0010b373:
            x_3 = x_3 - 1;
            if (x_3 != 0) {
              if (*local_790 == *(ulong *)(ringbuffer + limit2_3 + uVar15)) goto LAB_0010b3d5;
              iVar9 = 0;
              for (uVar15 = *local_790 ^ *(ulong *)(ringbuffer + limit2_3 + uVar15);
                  (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                iVar9 = iVar9 + 1;
              }
              local_780 = ((ulong)(long)iVar9 >> 3) + limit2_3;
              goto LAB_0010b516;
            }
            matched_3 = (max_distance & 7) + 1;
            while (matched_3 = matched_3 - 1, matched_3 != 0) {
              if (ringbuffer[limit2_3 + uVar15] != (uint8_t)*local_790) {
                local_780 = limit2_3;
                goto LAB_0010b516;
              }
              local_790 = (ulong *)((long)local_790 + 1);
              limit2_3 = limit2_3 + 1;
            }
            local_780 = limit2_3;
LAB_0010b516:
            if (((2 < local_780) || ((local_780 == 2 && (backward_3 < 2)))) &&
               (uStack_8b8 = local_780 * 0x87 + 0x78f, best_len_1 < uStack_8b8)) {
              if (backward_3 != 0) {
                uStack_8b8 = uStack_8b8 -
                             ((long)(int)(0x1ca10 >> ((byte)backward_3 & 0xe) & 0xe) + 0x27);
              }
              if (best_len_1 < uStack_8b8) {
                best_len_1 = uStack_8b8;
                i_2 = local_780;
                distance_code = local_780;
                sr2.distance = uStack_8b8;
                sr2.len = (size_t)puVar16;
              }
            }
          }
        }
        uVar8 = HashBytesH5(ringbuffer + uVar13,*(int *)(hasher + 0x38));
        lVar19 = (ulong)(uVar8 << ((byte)*(undefined4 *)(hasher + 8) & 0x1f)) * 4 +
                 lVar19 * 2 + 0x40;
        if (*(ulong *)(hasher + 0x30) < (ulong)*(ushort *)(hasher + (ulong)uVar8 * 2 + 0x40)) {
          local_c88 = (ulong)*(ushort *)(hasher + (ulong)uVar8 * 2 + 0x40) -
                      *(long *)(hasher + 0x30);
        }
        else {
          local_c88 = 0;
        }
        backward_3 = (size_t)*(ushort *)(hasher + (ulong)uVar8 * 2 + 0x40);
        while (local_c88 < backward_3) {
          backward_3 = backward_3 - 1;
          puVar16 = puVar14 + -(ulong)*(uint *)(hasher + (backward_3 & *(uint *)(hasher + 0x3c)) * 4
                                                         + lVar19);
          if (local_c80 < puVar16) break;
          uVar15 = ringbuffer_mask &
                   *(uint *)(hasher + (backward_3 & *(uint *)(hasher + 0x3c)) * 4 + lVar19);
          if (((uVar13 + i_2 <= ringbuffer_mask) && (uVar15 + i_2 <= ringbuffer_mask)) &&
             (ringbuffer[uVar13 + i_2] == ringbuffer[uVar15 + i_2])) {
            local_7d0 = (ulong *)(ringbuffer + uVar13);
            limit2_4 = 0;
            x_4 = (max_distance >> 3) + 1;
LAB_0010b855:
            x_4 = x_4 - 1;
            if (x_4 != 0) {
              if (*local_7d0 == *(ulong *)(ringbuffer + limit2_4 + uVar15)) goto LAB_0010b8b7;
              iVar9 = 0;
              for (uVar15 = *local_7d0 ^ *(ulong *)(ringbuffer + limit2_4 + uVar15);
                  (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                iVar9 = iVar9 + 1;
              }
              local_7c0 = ((ulong)(long)iVar9 >> 3) + limit2_4;
              goto LAB_0010b9f8;
            }
            matched_4 = (max_distance & 7) + 1;
            while (matched_4 = matched_4 - 1, matched_4 != 0) {
              if (ringbuffer[limit2_4 + uVar15] != (uint8_t)*local_7d0) {
                local_7c0 = limit2_4;
                goto LAB_0010b9f8;
              }
              local_7d0 = (ulong *)((long)local_7d0 + 1);
              limit2_4 = limit2_4 + 1;
            }
            local_7c0 = limit2_4;
LAB_0010b9f8:
            if (3 < local_7c0) {
              iVar9 = 0x1f;
              if ((uint)puVar16 != 0) {
                for (; (uint)puVar16 >> iVar9 == 0; iVar9 = iVar9 + -1) {
                }
              }
              uVar15 = (local_7c0 * 0x87 + 0x780) - (ulong)(uint)(iVar9 * 0x1e);
              if (best_len_1 < uVar15) {
                i_2 = local_7c0;
                distance_code = local_7c0;
                sr2.len = (size_t)puVar16;
                sr2.distance = uVar15;
                best_len_1 = uVar15;
              }
            }
          }
        }
        *(int *)(hasher + (ulong)((uint)*(ushort *)(hasher + (ulong)uVar8 * 2 + 0x40) &
                                 *(uint *)(hasher + 0x3c)) * 4 + lVar19) = (int)puVar14;
        *(short *)(hasher + (ulong)uVar8 * 2 + 0x40) =
             *(short *)(hasher + (ulong)uVar8 * 2 + 0x40) + 1;
        if ((sr2.distance == 0x7e4) &&
           (piVar21 = (int *)(ringbuffer + uVar13),
           *(ulong *)(hasher + 0x18) >> 7 <= *(ulong *)(hasher + 0x20))) {
          i_3 = (size_t)(((uint)(*piVar21 * 0x1e35a7bd) >> 0x12) << 1);
          for (self_3 = (HasherCommon *)0x0; self_3 < (HasherCommon *)0x2;
              self_3 = (HasherCommon *)((long)&(self_3->params).type + 1)) {
            uVar1 = (params->dictionary).hash_table[i_3];
            uVar13 = (ulong)uVar1;
            *(long *)(hasher + 0x18) = *(long *)(hasher + 0x18) + 1;
            if (uVar13 != 0) {
              uVar15 = uVar13 & 0x1f;
              uVar17 = (ulong)(uVar1 >> 5);
              if (max_distance < uVar15) {
                bVar6 = false;
              }
              else {
                local_5e8 = (ulong *)(pBVar22->words->data +
                                     (ulong)pBVar22->words->offsets_by_length[uVar15] +
                                     uVar15 * uVar17);
                limit2_5 = 0;
                x_5 = (uVar15 >> 3) + 1;
LAB_0010bdd4:
                x_5 = x_5 - 1;
                if (x_5 != 0) {
                  if (*local_5e8 == *(ulong *)((long)piVar21 + limit2_5)) goto LAB_0010be36;
                  iVar9 = 0;
                  for (uVar13 = *local_5e8 ^ *(ulong *)((long)piVar21 + limit2_5); (uVar13 & 1) == 0
                      ; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
                    iVar9 = iVar9 + 1;
                  }
                  local_5d8 = ((ulong)(long)iVar9 >> 3) + limit2_5;
                  goto LAB_0010bf77;
                }
                matched_5 = (uVar13 & 7) + 1;
                while (matched_5 = matched_5 - 1, matched_5 != 0) {
                  if (*(char *)((long)piVar21 + limit2_5) != (char)*local_5e8) {
                    local_5d8 = limit2_5;
                    goto LAB_0010bf77;
                  }
                  local_5e8 = (ulong *)((long)local_5e8 + 1);
                  limit2_5 = limit2_5 + 1;
                }
                local_5d8 = limit2_5;
LAB_0010bf77:
                if ((uVar15 < local_5d8 + (params->dictionary).cutoffTransformsCount) &&
                   (local_5d8 != 0)) {
                  puVar14 = local_c80 +
                            ((uVar15 - local_5d8) * 4 +
                             ((params->dictionary).cutoffTransforms >>
                              ((char)(uVar15 - local_5d8) * '\x06' & 0x3fU) & 0x3f) <<
                            (pBVar22->words->size_bits_by_length[uVar15] & 0x3f)) + uVar17 + 1;
                  if (puVar18 < puVar14) {
                    bVar6 = false;
                  }
                  else {
                    iVar9 = 0x1f;
                    if ((uint)puVar14 != 0) {
                      for (; (uint)puVar14 >> iVar9 == 0; iVar9 = iVar9 + -1) {
                      }
                    }
                    uVar13 = (local_5d8 * 0x87 + 0x780) - (ulong)(uint)(iVar9 * 0x1e);
                    if (uVar13 < sr2.distance) {
                      bVar6 = false;
                    }
                    else {
                      distance_code = local_5d8;
                      sr2.score._0_4_ = (int)uVar15 - (int)local_5d8;
                      bVar6 = true;
                      sr2.len = (size_t)puVar14;
                      sr2.distance = uVar13;
                    }
                  }
                }
                else {
                  bVar6 = false;
                }
              }
              if (bVar6) {
                *(long *)(hasher + 0x20) = *(long *)(hasher + 0x20) + 1;
              }
            }
            i_3 = i_3 + 1;
          }
        }
        puVar18 = ringbuffer_local;
        uVar3 = (uint)sr.score;
        if (sr2.distance < sr.distance + 0xaf) goto LAB_0010c231;
        puVar18 = ringbuffer_local + 1;
        pos_end = pos_end + 1;
        sStack_be8 = distance_code;
        sr.len = sr2.len;
        sr.distance = sr2.distance;
        sr.score = (size_t)(uint)sr2.score;
        cost_diff_lazy._4_4_ = cost_diff_lazy._4_4_ + 1;
        uVar3 = (uint)sr2.score;
        if ((3 < cost_diff_lazy._4_4_) ||
           (puVar14 = ringbuffer_local + 5, ringbuffer_local = puVar18, puVar11 <= puVar14))
        goto LAB_0010c231;
      } while( true );
    }
    pos_end = pos_end + 1;
    puVar18 = ringbuffer_local + 1;
    if (gap < puVar18) {
      if ((uint8_t *)(gap + lVar12 * 4) < puVar18) {
        puVar14 = ringbuffer_local + 0x11;
        local_cd0 = puVar11 + -4;
        ringbuffer_local = puVar18;
        if (puVar14 < local_cd0) {
          local_cd0 = puVar14;
        }
        for (; puVar18 = ringbuffer_local, ringbuffer_local < local_cd0;
            ringbuffer_local = ringbuffer_local + 4) {
          uVar8 = HashBytesH5(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask),
                              *(int *)(hasher + 0x38));
          *(int *)(hasher + ((ulong)((uint)*(ushort *)(hasher + (ulong)uVar8 * 2 + 0x40) &
                                    *(uint *)(hasher + 0x3c)) +
                            (ulong)(uVar8 << ((byte)*(undefined4 *)(hasher + 8) & 0x1f))) * 4 +
                            *(long *)(hasher + 0x28) * 2 + 0x40) = (int)ringbuffer_local;
          *(short *)(hasher + (ulong)uVar8 * 2 + 0x40) =
               *(short *)(hasher + (ulong)uVar8 * 2 + 0x40) + 1;
          pos_end = pos_end + 4;
        }
      }
      else {
        puVar14 = ringbuffer_local + 9;
        local_ce0 = puVar11 + -3;
        ringbuffer_local = puVar18;
        if (puVar14 < local_ce0) {
          local_ce0 = puVar14;
        }
        for (; puVar18 = ringbuffer_local, ringbuffer_local < local_ce0;
            ringbuffer_local = ringbuffer_local + 2) {
          uVar8 = HashBytesH5(ringbuffer + ((ulong)ringbuffer_local & ringbuffer_mask),
                              *(int *)(hasher + 0x38));
          *(int *)(hasher + ((ulong)((uint)*(ushort *)(hasher + (ulong)uVar8 * 2 + 0x40) &
                                    *(uint *)(hasher + 0x3c)) +
                            (ulong)(uVar8 << ((byte)*(undefined4 *)(hasher + 8) & 0x1f))) * 4 +
                            *(long *)(hasher + 0x28) * 2 + 0x40) = (int)ringbuffer_local;
          *(short *)(hasher + (ulong)uVar8 * 2 + 0x40) =
               *(short *)(hasher + (ulong)uVar8 * 2 + 0x40) + 1;
          pos_end = pos_end + 2;
        }
      }
    }
  } while( true );
LAB_0010a190:
  local_430 = local_430 + 1;
  limit2 = limit2 + 8;
  goto LAB_0010a12e;
LAB_0010a672:
  local_470 = local_470 + 1;
  limit2_1 = limit2_1 + 8;
  goto LAB_0010a610;
LAB_0010abf1:
  local_288 = local_288 + 1;
  limit2_2 = limit2_2 + 8;
  goto LAB_0010ab8f;
LAB_0010b3d5:
  local_790 = local_790 + 1;
  limit2_3 = limit2_3 + 8;
  goto LAB_0010b373;
LAB_0010b8b7:
  local_7d0 = local_7d0 + 1;
  limit2_4 = limit2_4 + 8;
  goto LAB_0010b855;
LAB_0010be36:
  local_5e8 = local_5e8 + 1;
  limit2_5 = limit2_5 + 8;
  goto LAB_0010bdd4;
LAB_0010c231:
  sr.score._0_4_ = uVar3;
  ringbuffer_local = puVar18;
  gap = (size_t)(ringbuffer_local + lVar12 + sStack_be8 * 2);
  local_c90 = puVar10;
  if (ringbuffer_local < puVar10) {
    local_c90 = ringbuffer_local;
  }
  if (sr.len <= local_c90) {
    uVar13 = (sr.len + 3) - (long)*dist_cache;
    uVar15 = (sr.len + 3) - (long)dist_cache[1];
    if (sr.len == (long)*dist_cache) {
      local_a88 = 0;
      goto LAB_0010c454;
    }
    if (sr.len == (long)dist_cache[1]) {
      local_a88 = 1;
      goto LAB_0010c454;
    }
    if (uVar13 < 7) {
      local_a88 = (ulong)(int)(0x9750468 >> ((byte)((uVar13 & 0x3fffffff) << 2) & 0x1f) & 0xf);
      goto LAB_0010c454;
    }
    if (uVar15 < 7) {
      local_a88 = (ulong)(int)(0xfdb1ace >> ((byte)((uVar15 & 0x3fffffff) << 2) & 0x1f) & 0xf);
      goto LAB_0010c454;
    }
    if (sr.len == (long)dist_cache[2]) {
      local_a88 = 2;
      goto LAB_0010c454;
    }
    if (sr.len == (long)dist_cache[3]) {
      local_a88 = 3;
      goto LAB_0010c454;
    }
  }
  local_a88 = sr.len + 0xf;
LAB_0010c454:
  if ((sr.len <= local_c90) && (local_a88 != 0)) {
    dist_cache[3] = dist_cache[2];
    dist_cache[2] = dist_cache[1];
    dist_cache[1] = *dist_cache;
    *dist_cache = (int)sr.len;
    iVar9 = *(int *)(hasher + 0x10);
    if (4 < iVar9) {
      iVar2 = *dist_cache;
      dist_cache[4] = iVar2 + -1;
      dist_cache[5] = iVar2 + 1;
      dist_cache[6] = iVar2 + -2;
      dist_cache[7] = iVar2 + 2;
      dist_cache[8] = iVar2 + -3;
      dist_cache[9] = iVar2 + 3;
      if (10 < iVar9) {
        iVar9 = dist_cache[1];
        dist_cache[10] = iVar9 + -1;
        dist_cache[0xb] = iVar9 + 1;
        dist_cache[0xc] = iVar9 + -2;
        dist_cache[0xd] = iVar9 + 2;
        dist_cache[0xe] = iVar9 + -3;
        dist_cache[0xf] = iVar9 + 3;
      }
    }
  }
  uVar8 = (uint32_t)pos_end;
  commands->insert_len_ = uVar8;
  commands->copy_len_ = (uint)sStack_be8 | (uint)sr.score << 0x19;
  uVar3 = (params->dist).num_direct_distance_codes;
  uVar4 = (params->dist).distance_postfix_bits;
  if (local_a88 < (ulong)uVar3 + 0x10) {
    commands->dist_prefix_ = (uint16_t)local_a88;
    commands->dist_extra_ = 0;
  }
  else {
    bVar5 = (byte)uVar4;
    uVar13 = (1L << (bVar5 + 2 & 0x3f)) + ((local_a88 - 0x10) - (ulong)uVar3);
    iVar9 = 0x1f;
    if ((uint)uVar13 != 0) {
      for (; (uint)uVar13 >> iVar9 == 0; iVar9 = iVar9 + -1) {
      }
    }
    bVar20 = (byte)(iVar9 - 1U);
    uVar15 = uVar13 >> (bVar20 & 0x3f) & 1;
    lVar19 = (ulong)(iVar9 - 1U) - (ulong)uVar4;
    commands->dist_prefix_ =
         (short)lVar19 * 0x400 |
         (short)uVar3 + 0x10 + (short)((lVar19 + -1) * 2 + uVar15 << (bVar5 & 0x3f)) +
         ((ushort)uVar13 & (short)(1 << (bVar5 & 0x1f)) - 1U);
    commands->dist_extra_ = (uint32_t)(uVar13 - (uVar15 + 2 << (bVar20 & 0x3f)) >> (bVar5 & 0x3f));
  }
  iVar9 = (uint)sStack_be8 + (uint)sr.score;
  uVar13 = (ulong)iVar9;
  if (pos_end < 6) {
    local_972 = (ushort)pos_end;
  }
  else if (pos_end < 0x82) {
    iVar2 = 0x1f;
    if (uVar8 - 2 != 0) {
      for (; uVar8 - 2 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    local_972 = (short)(iVar2 + -1) * 2 + (short)(pos_end - 2 >> ((byte)(iVar2 + -1) & 0x3f)) + 2;
  }
  else if (pos_end < 0x842) {
    iVar2 = 0x1f;
    if (uVar8 - 0x42 != 0) {
      for (; uVar8 - 0x42 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    local_972 = (short)iVar2 + 10;
  }
  else if (pos_end < 0x1842) {
    local_972 = 0x15;
  }
  else if (pos_end < 0x5842) {
    local_972 = 0x16;
  }
  else {
    local_972 = 0x17;
  }
  if (uVar13 < 10) {
    local_94a = (short)iVar9 - 2;
  }
  else if (uVar13 < 0x86) {
    iVar2 = 0x1f;
    if (iVar9 - 6U != 0) {
      for (; iVar9 - 6U >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    local_94a = (short)(iVar2 + -1) * 2 + (short)(uVar13 - 6 >> ((byte)(iVar2 + -1) & 0x3f)) + 4;
  }
  else if (uVar13 < 0x846) {
    iVar2 = 0x1f;
    if (iVar9 - 0x46U != 0) {
      for (; iVar9 - 0x46U >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    local_94a = (short)iVar2 + 0xc;
  }
  else {
    local_94a = 0x17;
  }
  local_922 = local_94a & 7 | (local_972 & 7) << 3;
  if ((((commands->dist_prefix_ & 0x3ff) == 0) && (local_972 < 8)) && (local_94a < 0x10)) {
    if (7 < local_94a) {
      local_922 = local_922 | 0x40;
    }
  }
  else {
    iVar9 = ((int)(uint)local_94a >> 3) + ((int)(uint)local_972 >> 3) * 3;
    local_922 = (short)iVar9 * 0x40 + 0x40 +
                ((ushort)(0x520d40 >> ((char)iVar9 * '\x02' & 0x1fU)) & 0xc0) | local_922;
  }
  commands->cmd_prefix_ = local_922;
  *num_literals = pos_end + *num_literals;
  pos_end = 0;
  range_end = (size_t)(ringbuffer_local + 2);
  local_ca8 = ringbuffer_local + sStack_be8;
  if (local_c58 <= local_ca8) {
    local_ca8 = local_c58;
  }
  if (sr.len < sStack_be8 >> 2) {
    local_cb8 = ringbuffer_local + sr.len * -4 + sStack_be8;
    if (local_cb8 < range_end) {
      local_cb8 = (uint8_t *)range_end;
    }
    if (local_ca8 < local_cb8) {
      local_cc0 = local_ca8;
    }
    else {
      local_cc0 = local_cb8;
    }
    range_end = (size_t)local_cc0;
  }
  for (local_230 = (uint8_t *)range_end; local_230 < local_ca8; local_230 = local_230 + 1) {
    uVar8 = HashBytesH5(ringbuffer + ((ulong)local_230 & ringbuffer_mask),*(int *)(hasher + 0x38));
    *(int *)(hasher + ((ulong)((uint)*(ushort *)(hasher + (ulong)uVar8 * 2 + 0x40) &
                              *(uint *)(hasher + 0x3c)) +
                      (ulong)(uVar8 << ((byte)*(undefined4 *)(hasher + 8) & 0x1f))) * 4 +
                      *(long *)(hasher + 0x28) * 2 + 0x40) = (int)local_230;
    *(short *)(hasher + (ulong)uVar8 * 2 + 0x40) = *(short *)(hasher + (ulong)uVar8 * 2 + 0x40) + 1;
  }
  commands = commands + 1;
  puVar18 = ringbuffer_local + sStack_be8;
  goto LAB_00109d8d;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    const BrotliEncoderParams* params, HasherHandle hasher, int* dist_cache,
    size_t* last_insert_len, Command* commands, size_t* num_commands,
    size_t* num_literals) {
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = 0;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(hasher, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    HasherSearchResult sr;
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(hasher, &params->dictionary,
                         ringbuffer, ringbuffer_mask, dist_cache, position,
                         max_length, max_distance, gap,
                         params->dist.max_distance, &sr);
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        FN(FindLongestMatch)(hasher, &params->dictionary,
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, gap, params->dist.max_distance, &sr2);
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code =
            ComputeDistanceCode(sr.distance, max_distance + gap, dist_cache);
        if ((sr.distance <= (max_distance + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(hasher, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(hasher, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(hasher, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}